

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::CreateLinkLibs
          (cmMakefileTargetGenerator *this,cmLinkLineComputer *linkLineComputer,string *linkLibs,
          bool useResponseFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  cmMakefile *this_00;
  string *config_00;
  long lVar1;
  string local_188;
  undefined1 local_168 [8];
  string link_rsp;
  char *responseFlag;
  allocator<char> local_119;
  undefined1 local_118 [8];
  string responseFlagVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  cmComputeLinkInformation *local_b8;
  cmComputeLinkInformation *pcli;
  allocator<char> local_99;
  string local_98;
  string *local_78;
  string *config;
  string linkPath;
  string frameworkPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends_local;
  bool useResponseFile_local;
  string *linkLibs_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmMakefileTargetGenerator *this_local;
  
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&config);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_BUILD_TYPE",&local_99);
  config_00 = cmMakefile::GetSafeDefinition(this_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  local_78 = config_00;
  local_b8 = cmGeneratorTarget::GetLinkInformation
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,config_00);
  cmLocalGenerator::OutputLinkLibraries
            ((cmLocalGenerator *)this->LocalGenerator,local_b8,linkLineComputer,linkLibs,
             (string *)((long)&linkPath.field_2 + 8),(string *)&config);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&responseFlagVar.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkPath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config);
  std::operator+(&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&responseFlagVar.field_2 + 8),linkLibs);
  std::__cxx11::string::operator=((string *)linkLibs,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)(responseFlagVar.field_2._M_local_buf + 8));
  if (useResponseFile) {
    lVar1 = std::__cxx11::string::find_first_not_of((char)linkLibs,0x20);
    if (lVar1 != -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"CMAKE_",&local_119);
      std::allocator<char>::~allocator(&local_119);
      cmGeneratorTarget::GetLinkerLanguage
                ((string *)&responseFlag,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 &(this->super_cmCommonTargetGenerator).ConfigName);
      std::__cxx11::string::operator+=((string *)local_118,(string *)&responseFlag);
      std::__cxx11::string::~string((string *)&responseFlag);
      std::__cxx11::string::operator+=((string *)local_118,"_RESPONSE_FILE_LINK_FLAG");
      link_rsp.field_2._8_8_ =
           cmMakefile::GetDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_118);
      if ((char *)link_rsp.field_2._8_8_ == (char *)0x0) {
        link_rsp.field_2._8_8_ = (long)"\\/@" + 2;
      }
      CreateResponseFile((string *)local_168,this,"linklibs.rsp",linkLibs,makefile_depends);
      std::__cxx11::string::operator=((string *)linkLibs,(char *)link_rsp.field_2._8_8_);
      cmOutputConverter::ConvertToOutputFormat
                (&local_188,
                 &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_168,SHELL);
      std::__cxx11::string::operator+=((string *)linkLibs,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)local_118);
    }
  }
  std::__cxx11::string::~string((string *)&config);
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkLibs(
  cmLinkLineComputer* linkLineComputer, std::string& linkLibs,
  bool useResponseFile, std::vector<std::string>& makefile_depends)
{
  std::string frameworkPath;
  std::string linkPath;
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmComputeLinkInformation* pcli =
    this->GeneratorTarget->GetLinkInformation(config);
  this->LocalGenerator->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                            frameworkPath, linkPath);
  linkLibs = frameworkPath + linkPath + linkLibs;

  if (useResponseFile &&
      linkLibs.find_first_not_of(' ') != std::string::npos) {
    // Lookup the response file reference flag.
    std::string responseFlagVar = "CMAKE_";
    responseFlagVar +=
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    responseFlagVar += "_RESPONSE_FILE_LINK_FLAG";
    const char* responseFlag = this->Makefile->GetDefinition(responseFlagVar);
    if (!responseFlag) {
      responseFlag = "@";
    }

    // Create this response file.
    std::string link_rsp =
      this->CreateResponseFile("linklibs.rsp", linkLibs, makefile_depends);

    // Reference the response file.
    linkLibs = responseFlag;
    linkLibs += this->LocalGenerator->ConvertToOutputFormat(
      link_rsp, cmOutputConverter::SHELL);
  }
}